

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::TestCase::hasTag(TestCase *this,string *tag)

{
  const_iterator cVar1;
  string sStack_38;
  
  toLower(&sStack_38,tag);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->super_TestCaseInfo).tags._M_t,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return (_Rb_tree_header *)cVar1._M_node !=
         &(this->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool TestCase::hasTag( std::string const& tag ) const {
        return tags.find( toLower( tag ) ) != tags.end();
    }